

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O0

JSONValue * JSON::Parse(char *data)

{
  size_t sVar1;
  wchar_t *data_00;
  wchar_t *__pwcs;
  char *in_RDI;
  JSONValue *value;
  wchar_t *w_data;
  size_t length;
  undefined8 local_8;
  
  sVar1 = strlen(in_RDI);
  data_00 = (wchar_t *)(sVar1 + 1);
  __pwcs = (wchar_t *)malloc((long)data_00 * 4);
  sVar1 = mbstowcs(__pwcs,in_RDI,(size_t)data_00);
  if (sVar1 == 0xffffffffffffffff) {
    free(__pwcs);
    local_8 = (JSONValue *)0x0;
  }
  else {
    local_8 = Parse(data_00);
    free(__pwcs);
  }
  return local_8;
}

Assistant:

JSONValue *JSON::Parse(const char *data)
{
	size_t length = strlen(data) + 1;
	wchar_t *w_data = (wchar_t*)malloc(length * sizeof(wchar_t));
	
	#if defined(WIN32) && !defined(__GNUC__)
		size_t ret_value = 0;
		if (mbstowcs_s(&ret_value, w_data, length, data, length) != 0)
		{
			free(w_data);
			return NULL;
		}
	#elif defined(ANDROID)
		// mbstowcs seems to misbehave on android
		for(size_t i = 0; i<length; i++)
			w_data[i] = (wchar_t)data[i];
	#else
		if (mbstowcs(w_data, data, length) == (size_t)-1)
		{
			free(w_data);
			return NULL;
		}
	#endif
	
	JSONValue *value = JSON::Parse(w_data);
	free(w_data);
	return value;
}